

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

ComponentHandle<A,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<A,A_const&>(EntityManager *this,Id id,A *args)

{
  ComponentHandle<A,_entityx::EntityManager> CVar1;
  Family __position;
  Entity local_38;
  ComponentHandle<A,_entityx::EntityManager> component;
  
  __position = Component<A>::family();
  accomodate_component<A>(this);
  Catch::clara::std::bitset<64UL>::set
            ((bitset<64UL> *)((id.id_ & 0xffffffff) * 8 + *(long *)(this + 0x48)),__position,true);
  local_38.manager_ = this;
  local_38.id_.id_ = id.id_;
  component.manager_ = this;
  component.id_.id_ = id.id_;
  EventManager::
  emit<entityx::ComponentAddedEvent<A>,entityx::Entity,entityx::ComponentHandle<A,entityx::EntityManager>&>
            (*(EventManager **)(this + 0x10),&local_38,&component);
  CVar1.id_.id_ = component.id_.id_;
  CVar1.manager_ = component.manager_;
  return CVar1;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }